

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Method.cpp
# Opt level: O0

CompiledMethod *
Lodtalk::CompiledMethod::newMethodWithHeader
          (VMContext *context,size_t numberOfBytes,CompiledMethodHeader header)

{
  uint uVar1;
  ProtoObject PVar2;
  CompiledMethod *ptr;
  size_t sVar3;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar4;
  ObjectHeader local_a0;
  CompiledMethodHeader *methodHeader;
  ulong local_88;
  size_t i;
  size_t literalCount;
  Oop *methodBody;
  ObjectHeader *objectHeader;
  uint8_t *methodData;
  bool bigObject;
  unsigned_long objectSize;
  unsigned_long bodySize;
  unsigned_long headerSize;
  size_t extraFormatBits;
  size_t slotCount;
  size_t wordMask;
  size_t wordSize;
  size_t numberOfBytes_local;
  VMContext *context_local;
  CompiledMethodHeader header_local;
  
  PVar2.object_header_ = (ObjectHeader)(numberOfBytes + 0xf >> 3);
  context_local = (VMContext *)header.oop.field_0;
  if ((ulong)((long)PVar2.object_header_ << 3) < numberOfBytes + 8) {
    __assert_fail("slotCount*wordSize >= numberOfBytes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/Method.cpp"
                  ,0x24,
                  "static CompiledMethod *Lodtalk::CompiledMethod::newMethodWithHeader(VMContext *, size_t, CompiledMethodHeader)"
                 );
  }
  ptr = (CompiledMethod *)
        VMContext::allocateObjectMemory
                  (context,(long)PVar2.object_header_ * 8 + 8,0xfe < (ulong)PVar2.object_header_);
  local_a0 = PVar2.object_header_;
  if (0xfe < (ulong)PVar2.object_header_) {
    local_a0 = (ObjectHeader)0xff;
  }
  (ptr->super_ByteArray).super_ArrayedCollection.super_SequenceableCollection.super_Collection.
  super_Object.super_ProtoObject.object_header_ =
       (ObjectHeader)
       ((ulong)(ptr->super_ByteArray).super_ArrayedCollection.super_SequenceableCollection.
               super_Collection.super_Object.super_ProtoObject.object_header_ & 0xffffffffffffff00 |
       (ulong)local_a0 & 0xff);
  uVar1 = generateIdentityHash(ptr);
  (ptr->super_ByteArray).super_ArrayedCollection.super_SequenceableCollection.super_Collection.
  super_Object.super_ProtoObject.object_header_ =
       (ObjectHeader)
       ((ulong)(ptr->super_ByteArray).super_ArrayedCollection.super_SequenceableCollection.
               super_Collection.super_Object.super_ProtoObject.object_header_ & 0xffffffff000003ff |
       ((ulong)uVar1 & 0x3fffff) << 10);
  (ptr->super_ByteArray).super_ArrayedCollection.super_SequenceableCollection.super_Collection.
  super_Object.super_ProtoObject.object_header_ =
       (ObjectHeader)
       ((ulong)(ptr->super_ByteArray).super_ArrayedCollection.super_SequenceableCollection.
               super_Collection.super_Object.super_ProtoObject.object_header_ & 0xffffff07ffffffff |
       ((ulong)(((uint)(numberOfBytes + 8) & 7) + 0x18) & 0x1f) << 0x23);
  (ptr->super_ByteArray).super_ArrayedCollection.super_SequenceableCollection.super_Collection.
  super_Object.super_ProtoObject.object_header_ =
       (ObjectHeader)
       ((ulong)(ptr->super_ByteArray).super_ArrayedCollection.super_SequenceableCollection.
               super_Collection.super_Object.super_ProtoObject.object_header_ & 0x3ffffffffff |
       0x1580000000000);
  if (0xfe < (ulong)PVar2.object_header_) {
    ptr[-1].super_ByteArray.super_ArrayedCollection.super_SequenceableCollection.super_Collection.
    super_Object.super_ProtoObject.object_header_ = PVar2.object_header_;
  }
  sVar3 = CompiledMethodHeader::getLiteralCount((CompiledMethodHeader *)&context_local);
  for (local_88 = 0; local_88 < sVar3 + 1; local_88 = local_88 + 1) {
    aVar4 = (anon_union_8_4_0eb573b0_for_Oop_0)nilOop();
    *(anon_union_8_4_0eb573b0_for_Oop_0 *)(ptr + 1 + local_88) = aVar4;
  }
  ptr[1].super_ByteArray.super_ArrayedCollection.super_SequenceableCollection.super_Collection.
  super_Object.super_ProtoObject.object_header_ = (ObjectHeader)context_local;
  return ptr;
}

Assistant:

CompiledMethod *CompiledMethod::newMethodWithHeader(VMContext *context, size_t numberOfBytes, CompiledMethodHeader header)
{
	// Add the method header size
	numberOfBytes += sizeof(void*);

	// Compute the some masks
	const size_t wordSize = sizeof(void*);
	const size_t wordMask = wordSize -1;

	// Compute the number of slots
	size_t slotCount = ((numberOfBytes + wordSize - 1) & (~wordMask)) / wordSize;
	size_t extraFormatBits = numberOfBytes & wordMask;
	assert(slotCount*wordSize >= numberOfBytes);

	// Compute the header size.
	auto headerSize = sizeof(ObjectHeader);
	auto bodySize = slotCount*sizeof(void*);
	auto objectSize = headerSize + bodySize;

	// Allocate the compiled method
    auto bigObject = slotCount >= 255;
	auto methodData = context->allocateObjectMemory(objectSize, bigObject);
	auto objectHeader = reinterpret_cast<ObjectHeader*> (methodData);

	// Set the method header
	objectHeader->slotCount = slotCount < 255 ? slotCount : 255;
	objectHeader->identityHash = generateIdentityHash(methodData);
	objectHeader->objectFormat = (unsigned int)(OF_COMPILED_METHOD + extraFormatBits);
	objectHeader->classIndex = SCI_CompiledMethod;
	if(bigObject)
        reinterpret_cast<uint64_t*> (objectHeader)[-1] = slotCount;

	// Initialize the literals to nil
	auto methodBody = reinterpret_cast<Oop*> (methodData + headerSize);
	auto literalCount = header.getLiteralCount();
	for(size_t i = 0; i < literalCount + 1; ++i )
		methodBody[i] = nilOop();

	// Set the method header
	auto methodHeader = reinterpret_cast<CompiledMethodHeader*> (methodBody);
	*methodHeader = header;

	// Return the compiled method.
	return reinterpret_cast<CompiledMethod*> (methodData);
}